

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O0

void container_printf(container_t *c,uint8_t type)

{
  uint uVar1;
  undefined1 in_SIL;
  container_t *in_RDI;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar2;
  
  uVar2 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  container_unwrap_shared(in_RDI,&stack0xfffffffffffffff7);
  uVar1 = uVar2 >> 0x18;
  if (uVar1 == 1) {
    bitset_container_printf((bitset_container_t *)c);
  }
  else if (uVar1 == 2) {
    array_container_printf((array_container_t *)CONCAT44(uVar2,2));
  }
  else {
    run_container_printf((run_container_t *)CONCAT44(uVar2,uVar1));
  }
  return;
}

Assistant:

void container_printf(const container_t *c, uint8_t type) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_printf(const_CAST_bitset(c));
            return;
        case ARRAY_CONTAINER_TYPE:
            array_container_printf(const_CAST_array(c));
            return;
        case RUN_CONTAINER_TYPE:
            run_container_printf(const_CAST_run(c));
            return;
        default:
            roaring_unreachable;
    }
}